

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::VacuumInfo::Deserialize(VacuumInfo *this,Deserializer *deserializer)

{
  undefined1 uVar1;
  VacuumOptions options;
  uint uVar2;
  VacuumInfo *this_00;
  pointer pVVar4;
  pointer *__ptr;
  byte bVar5;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var6;
  unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true> result;
  _Head_base<0UL,_duckdb::VacuumInfo_*,_false> local_38;
  _Head_base<0UL,_duckdb::TableRef_*,_false> local_30;
  int iVar3;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"options");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  options = VacuumOptions::Deserialize(deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  this_00 = (VacuumInfo *)operator_new(0x38);
  VacuumInfo(this_00,options);
  local_38._M_head_impl = this_00;
  pVVar4 = unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::operator->
                     ((unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>
                       *)&local_38);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"has_table");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  pVVar4->has_table = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pVVar4 = unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::operator->
                     ((unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>
                       *)&local_38);
  iVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"ref");
  bVar5 = (byte)iVar3;
  if (bVar5 == 0) {
    _Var6._M_head_impl =
         (pVVar4->ref).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
         _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pVVar4->ref).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)0x0;
    if (_Var6._M_head_impl == (TableRef *)0x0) {
      bVar5 = 0;
      goto LAB_005d1b2c;
    }
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar3 == '\0') {
      local_30._M_head_impl = (TableRef *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      TableRef::Deserialize((TableRef *)&stack0xffffffffffffffd0,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var6._M_head_impl =
         (pVVar4->ref).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
         _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pVVar4->ref).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = local_30._M_head_impl;
    if (_Var6._M_head_impl == (TableRef *)0x0) {
      bVar5 = 1;
      goto LAB_005d1b2c;
    }
  }
  (*(_Var6._M_head_impl)->_vptr_TableRef[1])();
LAB_005d1b2c:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar5);
  pVVar4 = unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::operator->
                     ((unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>
                       *)&local_38);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0xcb,"columns",&pVVar4->columns);
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)local_38._M_head_impl;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> VacuumInfo::Deserialize(Deserializer &deserializer) {
	auto options = deserializer.ReadProperty<VacuumOptions>(200, "options");
	auto result = duckdb::unique_ptr<VacuumInfo>(new VacuumInfo(options));
	deserializer.ReadPropertyWithDefault<bool>(201, "has_table", result->has_table);
	deserializer.ReadPropertyWithDefault<unique_ptr<TableRef>>(202, "ref", result->ref);
	deserializer.ReadPropertyWithDefault<vector<string>>(203, "columns", result->columns);
	return std::move(result);
}